

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void test_qpixl_frqi_util_isfwht<float>(void)

{
  pointer *__ptr;
  char *pcVar1;
  char *pcVar2;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> a_c;
  vector<float,_std::allocator<float>_> a;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff78;
  AssertHelper local_80;
  char local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  double val2;
  double val1;
  vector<float,_std::allocator<float>_> local_38;
  vector<float,_std::allocator<float>_> local_20;
  
  local_78[0] = '\x1f';
  local_78[1] = -0x7b;
  local_78[2] = -0x55;
  local_78[3] = '?';
  local_78[4] = ')';
  local_78[5] = '\\';
  local_78[6] = 'O';
  local_78[7] = -0x40;
  __l._M_len = 0x10;
  __l._M_array = (iterator)local_78;
  std::vector<float,_std::allocator<float>_>::vector(&local_20,__l,(allocator_type *)&local_38);
  pcVar2 = (char *)0xc1591eb840c70a3d;
  val2 = -32768.0;
  val1 = 0.10000003863940947;
  local_78[0] = '\x1f';
  local_78[1] = -0x7b;
  local_78[2] = -0x55;
  local_78[3] = '?';
  local_78[4] = ')';
  local_78[5] = '\\';
  local_78[6] = 'O';
  local_78[7] = -0x40;
  __ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4181999a403851ec
  ;
  __l_00._M_len = 0x10;
  __l_00._M_array = (iterator)local_78;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_38,__l_00,(allocator_type *)&stack0xffffffffffffff78);
  qpixl::frqi::sfwht<std::vector<float,std::allocator<float>>>(&local_20);
  qpixl::frqi::isfwht<std::vector<float,std::allocator<float>>>(&local_20);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x114363,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x4f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff78._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x11441e,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x50,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (in_stack_ffffffffffffff78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x1144d9,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x51,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff78._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x114594,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x52,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (in_stack_ffffffffffffff78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x11464f,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x53,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff78._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x11470a,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x54,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (in_stack_ffffffffffffff78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x1147c5,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x55,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff78._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x114880,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x56,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (in_stack_ffffffffffffff78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x11493b,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x57,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff78._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x1149f6,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x58,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (in_stack_ffffffffffffff78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x114ab1,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x59,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff78._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x114b6c,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x5a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (in_stack_ffffffffffffff78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x114c27,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x5b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff78._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x114ce2,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x5c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (in_stack_ffffffffffffff78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x114d9d,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x5d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffff78._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff78._M_head_impl,(char *)0x114e58,pcVar2,val1,val2,
             (double)__ptr_00);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (in_stack_ffffffffffffff78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff90,__ptr_00);
  }
  if (local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_qpixl_frqi_util_isfwht() {

  const R eps = std::numeric_limits< R >::epsilon() ;

  std::vector< R > a = { 1.34 , -3.24 , 2.88 , 16.2 , 0 , -7 , 1.11 , 1.45 ,
                           6.22 , -13.57 , 4.9 , 5.31 , -2.81 , - 3.41 , -1.88 ,
                           10 };

  std::vector< R > a_c = { 1.34 , -3.24 , 2.88 , 16.2 , 0 , -7 , 1.11 , 1.45 ,
                           6.22 , -13.57 , 4.9 , 5.31 , -2.81 , - 3.41 , -1.88 ,
                           10 };
  qpixl::frqi::sfwht( a ) ;
  qpixl::frqi::isfwht( a ) ;

  EXPECT_NEAR( a[ 0] , a_c[ 0]  , 100*eps );
  EXPECT_NEAR( a[ 1] , a_c[ 1]  , 100*eps );
  EXPECT_NEAR( a[ 2] , a_c[ 2]  , 100*eps );
  EXPECT_NEAR( a[ 3] , a_c[ 3]  , 100*eps );
  EXPECT_NEAR( a[ 4] , a_c[ 4]  , 100*eps );
  EXPECT_NEAR( a[ 5] , a_c[ 5]  , 100*eps );
  EXPECT_NEAR( a[ 6] , a_c[ 6]  , 100*eps );
  EXPECT_NEAR( a[ 7] , a_c[ 7]  , 100*eps );
  EXPECT_NEAR( a[ 8] , a_c[ 8]  , 100*eps );
  EXPECT_NEAR( a[ 9] , a_c[ 9]  , 100*eps );
  EXPECT_NEAR( a[10] , a_c[10]  , 100*eps );
  EXPECT_NEAR( a[11] , a_c[11]  , 100*eps );
  EXPECT_NEAR( a[12] , a_c[12]  , 100*eps );
  EXPECT_NEAR( a[13] , a_c[13]  , 100*eps );
  EXPECT_NEAR( a[14] , a_c[14]  , 100*eps );
  EXPECT_NEAR( a[15] , a_c[15]  , 100*eps );

}